

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O2

VP8LEncoder * VP8LEncoderNew(WebPConfig *config,WebPPicture *picture)

{
  VP8LEncoder *pVVar1;
  
  pVVar1 = (VP8LEncoder *)WebPSafeCalloc(1,0x918);
  if (pVVar1 == (VP8LEncoder *)0x0) {
    WebPEncodingSetError(picture,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
    pVVar1->config_ = config;
    pVVar1->pic_ = picture;
    pVVar1->argb_content_ = kEncoderNone;
    VP8LEncDspInit();
  }
  return pVVar1;
}

Assistant:

static VP8LEncoder* VP8LEncoderNew(const WebPConfig* const config,
                                   const WebPPicture* const picture) {
  VP8LEncoder* const enc = (VP8LEncoder*)WebPSafeCalloc(1ULL, sizeof(*enc));
  if (enc == NULL) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    return NULL;
  }
  enc->config_ = config;
  enc->pic_ = picture;
  enc->argb_content_ = kEncoderNone;

  VP8LEncDspInit();

  return enc;
}